

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

EGLSurface
eglu::anon_unknown_1::createPBuffer
          (Library *egl,EGLDisplay display,EGLConfig eglConfig,RenderConfig *config)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  int local_60;
  int local_5c;
  undefined4 local_58;
  int local_54;
  EGLint attribList [5];
  EGLSurface surface;
  int height;
  int width;
  RenderConfig *config_local;
  EGLConfig eglConfig_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  if (config->width == -1) {
    local_5c = 0x200;
  }
  else {
    local_5c = config->width;
  }
  if (config->height == -1) {
    local_60 = 0x200;
  }
  else {
    local_60 = config->height;
  }
  local_58 = 0x3057;
  local_54 = local_5c;
  attribList[0] = 0x3056;
  attribList[1] = local_60;
  attribList[2] = 0x3038;
  iVar1 = (*egl->_vptr_Library[10])(egl,display,eglConfig,&local_58);
  err = (*egl->_vptr_Library[0x1f])();
  checkError(err,"eglCreatePbufferSurface()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x123);
  return (EGLSurface)CONCAT44(extraout_var,iVar1);
}

Assistant:

EGLSurface createPBuffer (const Library& egl, EGLDisplay display, EGLConfig eglConfig, const glu::RenderConfig& config)
{
	const int		width			= (config.width		== glu::RenderConfig::DONT_CARE ? DEFAULT_OFFSCREEN_WIDTH	: config.width);
	const int		height			= (config.height	== glu::RenderConfig::DONT_CARE ? DEFAULT_OFFSCREEN_HEIGHT	: config.height);
	EGLSurface		surface;
	const EGLint	attribList[]	=
	{
		EGL_WIDTH,	width,
		EGL_HEIGHT,	height,
		EGL_NONE
	};

	surface = egl.createPbufferSurface(display, eglConfig, &(attribList[0]));
	EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface()");

	return surface;
}